

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::OneofDescriptorProto::_InternalSerialize
          (OneofDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  OneofOptions *value;
  ulong uVar1;
  anon_union_24_1_493b367e_for_OneofDescriptorProto_3 aVar2;
  uint8_t *puVar3;
  char *in_R9;
  undefined8 *puVar4;
  string_view s;
  string_view field_name;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.OneofDescriptorProto.name";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x29,field_name);
    s._M_str = (char *)*puVar4;
    s._M_len = puVar4[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    value = (this->field_0)._impl_.options_;
    target = protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL OneofDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const OneofDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.OneofDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.OneofDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional .google.protobuf.OneofOptions options = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.OneofDescriptorProto)
  return target;
}